

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O0

void __thiscall MemorySSADumper::dumpBBlockDefinitions(MemorySSADumper *this,RWBBlock *block)

{
  DataDependenceAnalysisImpl *b;
  Definitions *pDVar1;
  MemorySSATransformation *in_RSI;
  Definitions *D;
  MemorySSATransformation *SSA;
  DefinitionsMap<dg::dda::RWNode> *in_stack_00000038;
  MemorySSADumper *in_stack_00000040;
  
  dg::dda::LLVMDataDependenceAnalysis::getDDA((LLVMDataDependenceAnalysis *)0x1778d0);
  b = dg::dda::DataDependenceAnalysis::getImpl((DataDependenceAnalysis *)0x1778d8);
  pDVar1 = dg::dda::MemorySSATransformation::getDefinitions(in_RSI,(RWBBlock *)b);
  if (pDVar1 != (Definitions *)0x0) {
    printf("<tr><td colspan=\"4\">==  defines ==</td></tr>");
    dumpDDIMap(in_stack_00000040,in_stack_00000038);
    printf("<tr><td colspan=\"4\">==  kills ==</td></tr>");
    dumpDDIMap(in_stack_00000040,in_stack_00000038);
  }
  return;
}

Assistant:

void dumpBBlockDefinitions(RWBBlock *block) override {
        auto *SSA = static_cast<MemorySSATransformation *>(
                DDA->getDDA()->getImpl());
        const auto *D = SSA->getDefinitions(block);
        if (!D)
            return;
        printf("<tr><td colspan=\"4\">==  defines ==</td></tr>");
        dumpDDIMap(D->definitions);
        printf("<tr><td colspan=\"4\">==  kills ==</td></tr>");
        dumpDDIMap(D->kills);
    }